

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O0

void __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::insert
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this,symbol x,
          ulint i)

{
  vector<bool,_std::allocator<bool>_> *in_RDX;
  undefined1 in_SIL;
  long in_RDI;
  vector<bool,_std::allocator<bool>_> code;
  undefined7 in_stack_00000058;
  size_type in_stack_ffffffffffffff98;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  *in_stack_ffffffffffffffa0;
  ulint in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined7 in_stack_fffffffffffffff0;
  
  if (*(long *)(in_RDI + 0x78) != 0) {
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::at(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)this,
                 (vector<bool,_std::allocator<bool>_> *)CONCAT17(x,in_stack_00000058));
      insert((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
             CONCAT17(in_SIL,in_stack_fffffffffffffff0),in_RDX,in_stack_ffffffffffffffe4,
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x159264);
    }
    *(long *)(in_RDI + 0x68) = *(long *)(in_RDI + 0x68) + 1;
  }
  return;
}

Assistant:

void insert(symbol x, ulint i){

		if(n==0)
			return;

	#ifdef DEBUG
		if(i>current_size){

			cout << "ERROR (DynamicString): trying to insert in position outside current string : " << i << ">" << current_size << endl;
			exit(0);

		}

		if(current_freqs.at(x)>=freq.at(x)){

			cout << "ERROR (DynamicString): too many symbols " << (uint)x << " inserted!" << endl;
			exit(0);

		}

		current_freqs.at(x) += 1;

	#endif


		if(not unary_string){

			vector<bool> code = codes.at(x);//bitvector to be inserted in the wavelet tree
			insert(&code,0,0,i);

		}

		current_size++;

	}